

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

string * __thiscall
cfd::core::DescriptorKeyReference::GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorKeyReference *this)

{
  DescriptorKeyReference *this_local;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->argument_);
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyReference::GetArgument() const { return argument_; }